

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

exr_result_t unpack_16bit(exr_decode_pipeline_t *decode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long in_RDI;
  int x;
  uint16_t *src;
  exr_coding_channel_info_t *decc_1;
  int c_1;
  int y;
  exr_coding_channel_info_t *decc;
  int c;
  int pixincrement;
  int h;
  int w;
  uint8_t *cdata;
  uint8_t *srcbuffer;
  int local_4c;
  undefined2 *local_48;
  int local_38;
  int local_34;
  int local_28;
  undefined2 *local_18;
  undefined2 *local_10;
  
  local_10 = *(undefined2 **)(in_RDI + 0x88);
  iVar1 = *(int *)(in_RDI + 0x2c);
  iVar2 = *(int *)(in_RDI + 100);
  for (local_28 = 0; local_28 < *(short *)(in_RDI + 0x10); local_28 = local_28 + 1) {
    local_10 = (undefined2 *)
               ((long)local_10 +
               (long)(*(int *)(*(long *)(in_RDI + 8) + (long)local_28 * 0x30 + 0xc) *
                      *(int *)(in_RDI + 0x60) * 2));
  }
  iVar3 = *(int *)(in_RDI + 0x60);
  for (local_34 = 0; local_34 < (iVar1 - iVar2) - iVar3; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < *(short *)(in_RDI + 0x10); local_38 = local_38 + 1) {
      lVar6 = *(long *)(in_RDI + 8) + (long)local_38 * 0x30;
      iVar4 = *(int *)(lVar6 + 0xc);
      iVar5 = *(int *)(lVar6 + 0x20);
      local_18 = (undefined2 *)
                 ((long)local_34 * (long)*(int *)(lVar6 + 0x24) + *(long *)(lVar6 + 0x28));
      if (iVar5 == 2) {
        memcpy(local_18,local_10,(long)iVar4 << 1);
      }
      else {
        local_48 = local_10;
        for (local_4c = 0; local_4c < iVar4; local_4c = local_4c + 1) {
          *local_18 = *local_48;
          local_18 = (undefined2 *)((long)local_18 + (long)iVar5);
          local_48 = local_48 + 1;
        }
      }
      local_10 = (undefined2 *)((long)local_10 + (long)(iVar4 << 1));
    }
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t* srcbuffer = decode->unpacked_buffer;
    uint8_t*       cdata;
    int            w, h, pixincrement;

    h = decode->chunk.height - decode->user_line_end_ignore;
    /*
     * if we have user_line_begin_skip, the user data pointer is at THAT
     * offset but our unpacked data is at y of '0' (well idx * height)
     */
    for (int c = 0; c < decode->channel_count; ++c)
    {
        exr_coding_channel_info_t* decc = (decode->channels + c);
        srcbuffer += decc->width * decode->user_line_begin_skip * 2;
    }
    h -= decode->user_line_begin_skip;

    for (int y = 0; y < h; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata        = decc->decode_to_ptr;
            w            = decc->width;
            pixincrement = decc->user_pixel_stride;
            cdata += (uint64_t) y * (uint64_t) decc->user_line_stride;
            /* specialize to memcpy if we can */
#if EXR_HOST_IS_NOT_LITTLE_ENDIAN
            if (pixincrement == 2)
            {
                uint16_t*       tmp = (uint16_t*) cdata;
                const uint16_t* src = (const uint16_t*) srcbuffer;
                uint16_t*       end = tmp + w;

                while (tmp < end)
                    *tmp++ = one_to_native16 (*src++);
            }
            else
            {
                const uint16_t* src = (const uint16_t*) srcbuffer;
                for (int x = 0; x < w; ++x)
                {
                    *((uint16_t*) cdata) = one_to_native16 (*src++);
                    cdata += pixincrement;
                }
            }
#else
            if (pixincrement == 2)
            {
                memcpy (cdata, srcbuffer, (size_t) (w) * 2);
            }
            else
            {
                const uint16_t* src = (const uint16_t*) srcbuffer;
                for (int x = 0; x < w; ++x)
                {
                    *((uint16_t*) cdata) = *src++;
                    cdata += pixincrement;
                }
            }
#endif
            srcbuffer += w * 2;
        }
    }
    return EXR_ERR_SUCCESS;
}